

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_file_system.cpp
# Opt level: O2

string * __thiscall
duckdb::GZipFileSystem::UncompressGZIPString_abi_cxx11_
          (string *__return_storage_ptr__,GZipFileSystem *this,char *data,idx_t size)

{
  uchar uVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  unsigned_long uVar5;
  pointer pmVar6;
  IOException *pIVar7;
  InternalException *this_00;
  uchar *puVar8;
  bool bVar9;
  templated_unique_single_t mz_stream_ptr;
  allocator local_2059;
  string local_2058;
  uint8_t gzip_hdr [10];
  uchar decompress_buffer [8192];
  
  make_uniq<duckdb_miniz::mz_stream_s>();
  *(undefined8 *)
   ((long)mz_stream_ptr.
          super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl + 0x60) = 0;
  *(undefined8 *)
   ((long)mz_stream_ptr.
          super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl + 0x68) = 0;
  *(undefined8 *)
   ((long)mz_stream_ptr.
          super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl + 0x50) = 0;
  *(undefined8 *)
   ((long)mz_stream_ptr.
          super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl + 0x58) = 0;
  *(undefined8 *)
   ((long)mz_stream_ptr.
          super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl + 0x40) = 0;
  *(undefined8 *)
   ((long)mz_stream_ptr.
          super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl + 0x48) = 0;
  *(undefined8 *)
   ((long)mz_stream_ptr.
          super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined8 *)
   ((long)mz_stream_ptr.
          super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl + 0x38) = 0;
  *(undefined8 *)
   ((long)mz_stream_ptr.
          super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl + 0x20) = 0;
  *(undefined8 *)
   ((long)mz_stream_ptr.
          super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl + 0x28) = 0;
  *(undefined8 *)
   ((long)mz_stream_ptr.
          super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 *)
   ((long)mz_stream_ptr.
          super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl + 0x18) = 0;
  *(undefined8 *)
   mz_stream_ptr.
   super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>._M_t
   .
   super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
   ._M_t.
   super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
   .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl = 0;
  *(undefined8 *)
   ((long)mz_stream_ptr.
          super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
          .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl + 8) = 0;
  if (data < (char *)0xa) {
    pIVar7 = (IOException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)decompress_buffer,"Input is not a GZIP stream",(allocator *)&local_2058);
    IOException::IOException(pIVar7,(string *)decompress_buffer);
    __cxa_throw(pIVar7,&IOException::typeinfo,::std::runtime_error::~runtime_error);
  }
  gzip_hdr._8_2_ =
       *(undefined2 *)&this[1].super_CompressedFileSystem.super_FileSystem._vptr_FileSystem;
  gzip_hdr._0_8_ = (this->super_CompressedFileSystem).super_FileSystem._vptr_FileSystem;
  VerifyGZIPHeader(gzip_hdr,10,(optional_ptr<duckdb::CompressedFile,_true>)0x0);
  if ((gzip_hdr._0_8_ & 0x4000000) != 0) {
    pIVar7 = (IOException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)decompress_buffer,"Extra field in a GZIP stream unsupported",
               (allocator *)&local_2058);
    IOException::IOException(pIVar7,(string *)decompress_buffer);
    __cxa_throw(pIVar7,&IOException::typeinfo,::std::runtime_error::~runtime_error);
  }
  puVar8 = (uchar *)((long)&this[1].super_CompressedFileSystem.super_FileSystem._vptr_FileSystem + 2
                    );
  if ((gzip_hdr._0_8_ & 0x8000000) != 0) {
    pcVar4 = (char *)0xb;
    do {
      uVar1 = *puVar8;
      puVar8 = puVar8 + 1;
      if (uVar1 == '\0') break;
      bVar9 = pcVar4 < data;
      pcVar4 = pcVar4 + 1;
    } while (bVar9);
  }
  iVar2 = duckdb_miniz::mz_inflateInit2
                    ((mz_streamp)
                     mz_stream_ptr.
                     super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                     ._M_t.
                     super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                     .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl,-0xf);
  if (iVar2 != 0) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)decompress_buffer,"Failed to initialize miniz",(allocator *)&local_2058);
    InternalException::InternalException(this_00,(string *)decompress_buffer);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  uVar5 = NumericCastImpl<unsigned_long,_long,_false>::Convert((long)puVar8 - (long)this);
  pmVar6 = unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
           ::operator->(&mz_stream_ptr);
  pmVar6->next_in = puVar8;
  uVar3 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert((long)data - uVar5);
  pmVar6 = unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
           ::operator->(&mz_stream_ptr);
  pmVar6->avail_in = uVar3;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar3 = 0;
  while( true ) {
    if (uVar3 != 0) {
      duckdb_miniz::mz_inflateEnd
                ((mz_streamp)
                 mz_stream_ptr.
                 super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                 .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl);
      if (__return_storage_ptr__->_M_string_length != 0) {
        std::unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
        ::~unique_ptr(&mz_stream_ptr.
                       super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                     );
        return __return_storage_ptr__;
      }
      pIVar7 = (IOException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)decompress_buffer,"Failed to uncompress",(allocator *)&local_2058);
      IOException::IOException(pIVar7,(string *)decompress_buffer);
      __cxa_throw(pIVar7,&IOException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pmVar6 = unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
             ::operator->(&mz_stream_ptr);
    pmVar6->next_out = decompress_buffer;
    pmVar6 = unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
             ::operator->(&mz_stream_ptr);
    pmVar6->avail_out = 0x2000;
    uVar3 = duckdb_miniz::mz_inflate
                      ((mz_streamp)
                       mz_stream_ptr.
                       super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                       .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl,0);
    if (1 < uVar3) break;
    unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>::
    operator->(&mz_stream_ptr);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)decompress_buffer);
  }
  pIVar7 = (IOException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_2058,"Failed to uncompress",&local_2059);
  IOException::IOException(pIVar7,&local_2058);
  __cxa_throw(pIVar7,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string GZipFileSystem::UncompressGZIPString(const char *data, idx_t size) {
	// decompress file
	auto body_ptr = data;

	auto mz_stream_ptr = make_uniq<duckdb_miniz::mz_stream>();
	memset(mz_stream_ptr.get(), 0, sizeof(duckdb_miniz::mz_stream));

	uint8_t gzip_hdr[GZIP_HEADER_MINSIZE];

	// check for incorrectly formatted files

	// TODO this is mostly the same as gzip_file_system.cpp
	if (size < GZIP_HEADER_MINSIZE) {
		throw IOException("Input is not a GZIP stream");
	}
	memcpy(gzip_hdr, body_ptr, GZIP_HEADER_MINSIZE);
	body_ptr += GZIP_HEADER_MINSIZE;
	GZipFileSystem::VerifyGZIPHeader(gzip_hdr, GZIP_HEADER_MINSIZE, nullptr);

	if (gzip_hdr[3] & GZIP_FLAG_EXTRA) {
		throw IOException("Extra field in a GZIP stream unsupported");
	}

	if (gzip_hdr[3] & GZIP_FLAG_NAME) {
		char c;
		do {
			c = *body_ptr;
			body_ptr++;
		} while (c != '\0' && static_cast<idx_t>(body_ptr - data) < size);
	}

	// stream is now set to beginning of payload data
	auto status = duckdb_miniz::mz_inflateInit2(mz_stream_ptr.get(), -MZ_DEFAULT_WINDOW_BITS);
	if (status != duckdb_miniz::MZ_OK) {
		throw InternalException("Failed to initialize miniz");
	}

	auto bytes_remaining = size - NumericCast<idx_t>(body_ptr - data);
	mz_stream_ptr->next_in = const_uchar_ptr_cast(body_ptr);
	mz_stream_ptr->avail_in = NumericCast<unsigned int>(bytes_remaining);

	string decompressed;

	while (status == duckdb_miniz::MZ_OK) {
		unsigned char decompress_buffer[BUFSIZ];
		mz_stream_ptr->next_out = decompress_buffer;
		mz_stream_ptr->avail_out = sizeof(decompress_buffer);
		status = mz_inflate(mz_stream_ptr.get(), duckdb_miniz::MZ_NO_FLUSH);
		if (status != duckdb_miniz::MZ_STREAM_END && status != duckdb_miniz::MZ_OK) {
			throw IOException("Failed to uncompress");
		}
		decompressed.append(char_ptr_cast(decompress_buffer), mz_stream_ptr->total_out - decompressed.size());
	}
	duckdb_miniz::mz_inflateEnd(mz_stream_ptr.get());

	if (decompressed.empty()) {
		throw IOException("Failed to uncompress");
	}
	return decompressed;
}